

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Index __thiscall wasm::Builder::addVar(Builder *this,Function *func,Name name,Type type)

{
  iterator __position;
  Index IVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 auStack_48 [8];
  Name name_local;
  Type type_local;
  Index index;
  
  pcVar4 = name.super_IString.str._M_str;
  sVar5 = name.super_IString.str._M_len;
  auStack_48 = (undefined1  [8])func;
  name_local.super_IString.str._M_len = sVar5;
  name_local.super_IString.str._M_str = pcVar4;
  if ((char *)0x1 < pcVar4) {
    IVar1 = wasm::Function::getNumLocals();
    type_local.id._4_4_ = IVar1;
    if (sVar5 != 0) {
      pmVar2 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(this + 0x14),(key_type *)auStack_48);
      *pmVar2 = IVar1;
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(this + 0xd),(key_type *)((long)&type_local.id + 4));
      (pmVar3->super_IString).str._M_len = (size_t)auStack_48;
      (pmVar3->super_IString).str._M_str = (char *)name_local.super_IString.str._M_len;
    }
    __position._M_current = (Type *)this[10].wasm;
    if ((Module *)__position._M_current == this[0xb].wasm) {
      std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type&>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)(this + 9),__position,
                 (Type *)&name_local.super_IString.str._M_str);
    }
    else {
      (__position._M_current)->id = (uintptr_t)pcVar4;
      this[10].wasm = (Module *)(__position._M_current + 1);
    }
    return type_local.id._4_4_;
  }
  __assert_fail("type.isConcrete()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x531,"static Index wasm::Builder::addVar(Function *, Name, Type)");
}

Assistant:

static Index addVar(Function* func, Name name, Type type) {
    // always ok to add a var, it does not affect other indices
    assert(type.isConcrete());
    Index index = func->getNumLocals();
    if (name.is()) {
      func->localIndices[name] = index;
      func->localNames[index] = name;
    }
    func->vars.emplace_back(type);
    return index;
  }